

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

Vec_Int_t * Ree_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvXors,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Hash_IntMan_t *pHash;
  Vec_Int_t *__ptr;
  int *piVar5;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *vData;
  Vec_Int_t *p_00;
  long lVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int fVerbose_00;
  uint uVar13;
  uint uVar14;
  long lVar15;
  double dVar16;
  
  pHash = (Hash_IntMan_t *)calloc(1,0x18);
  uVar14 = 1099;
  while( true ) {
    do {
      uVar13 = uVar14;
      uVar14 = uVar13 + 1;
    } while ((uVar13 & 1) != 0);
    if (uVar14 < 9) break;
    iVar10 = 5;
    while (uVar14 % (iVar10 - 2U) != 0) {
      uVar4 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar14 < uVar4) goto LAB_00660094;
    }
  }
LAB_00660094:
  __ptr = (Vec_Int_t *)malloc(0x10);
  uVar4 = uVar14;
  if (uVar13 < 0xf) {
    uVar4 = 0x10;
  }
  __ptr->nSize = 0;
  __ptr->nCap = uVar4;
  piVar5 = (int *)malloc((long)(int)uVar4 << 2);
  __ptr->pArray = piVar5;
  __ptr->nSize = uVar14;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)(int)uVar14 << 2);
  }
  pHash->vTable = __ptr;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 0x1130;
  __ptr_00->nSize = 0;
  piVar5 = (int *)malloc(0x44c0);
  __ptr_00->pArray = piVar5;
  pHash->vObjs = __ptr_00;
  piVar5[0] = 0;
  piVar5[1] = 0;
  piVar5[2] = 0;
  piVar5[3] = 0;
  __ptr_00->nSize = 4;
  pHash->nRefs = 1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar6->pArray = piVar5;
  vData = (Vec_Int_t *)malloc(0x10);
  vData->nCap = 1000;
  vData->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vData->pArray = piVar5;
  uVar14 = p->nObjs;
  iVar10 = (~(p->vCos->nSize + p->vCis->nSize) + uVar14) * 0x1e;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar10 - 1U < 0xf) {
    iVar10 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar5;
  if (iVar10 < (int)uVar14) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar14 << 2);
    }
    p_00->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset(p_00->pArray,0,(ulong)uVar14 * 4);
  }
  p_00->nSize = uVar14;
  Gia_ManCleanValue(p);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      iVar10 = pVVar8->pArray[lVar15];
      lVar7 = (long)iVar10;
      if ((lVar7 < 0) || (p->nObjs <= iVar10)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= iVar10) goto LAB_006606cb;
      pGVar9 = p->pObjs + lVar7;
      p_00->pArray[lVar7] = p_00->nSize;
      Vec_IntPush(p_00,1);
      Vec_IntPush(p_00,1);
      pGVar3 = p->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      Vec_IntPush(p_00,0xaa);
      lVar15 = lVar15 + 1;
      pVVar8 = p->vCis;
    } while (lVar15 < pVVar8->nSize);
  }
  if (pvXors != (Vec_Int_t **)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar8->pArray = piVar5;
    *pvXors = pVVar8;
  }
  iVar10 = p->nObjs;
  iVar12 = 0;
  if ((0 < iVar10) && (pGVar9 = p->pObjs, pGVar9 != (Gia_Obj_t *)0x0)) {
    iVar12 = 0;
    lVar15 = 0;
    do {
      uVar14 = (uint)*(undefined8 *)(pGVar9 + lVar15);
      if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
        iVar10 = (int)lVar15;
        uVar14 = iVar10 - (uVar14 & 0x1fffffff);
        if (((int)uVar14 < 0) || (iVar11 = p_00->nSize, iVar11 <= (int)uVar14)) goto LAB_006606ac;
        piVar5 = p_00->pArray;
        iVar1 = piVar5[uVar14];
        if (((long)iVar1 < 0) || (iVar11 <= iVar1)) {
LAB_006606ea:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar14 = iVar10 - ((uint)((ulong)*(undefined8 *)(pGVar9 + lVar15) >> 0x20) & 0x1fffffff);
        if (((int)uVar14 < 0) || (iVar11 <= (int)uVar14)) goto LAB_006606ac;
        iVar2 = piVar5[uVar14];
        if (((long)iVar2 < 0) || (iVar11 <= iVar2)) goto LAB_006606ea;
        if (pvXors == (Vec_Int_t **)0x0) {
          pVVar8 = (Vec_Int_t *)0x0;
        }
        else {
          pVVar8 = *pvXors;
        }
        Ree_ManCutMerge(p,iVar10,piVar5 + iVar1,piVar5 + iVar2,pVVar6,pHash,vData,pVVar8);
        if (iVar11 <= lVar15) {
LAB_006606cb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar5[lVar15] = iVar11;
        iVar10 = pVVar6->nSize;
        if ((long)iVar10 < 1) {
LAB_006606ac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = pVVar6->pArray;
        lVar7 = 0;
        do {
          Vec_IntPush(p_00,piVar5[lVar7]);
          lVar7 = lVar7 + 1;
        } while (iVar10 != lVar7);
        if (iVar10 < 1) goto LAB_006606ac;
        iVar12 = iVar12 + *pVVar6->pArray;
      }
      lVar15 = lVar15 + 1;
      iVar10 = p->nObjs;
    } while ((lVar15 < iVar10) && (pGVar9 = p->pObjs, pGVar9 != (Gia_Obj_t *)0x0));
  }
  if (fVerbose != 0) {
    dVar16 = (double)(iVar10 + ~(p->vCos->nSize + p->vCis->nSize));
    printf("AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           SUB84((double)iVar12 / dVar16,0),(double)p_00->nSize / dVar16);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pVVar6 = Ree_ManDeriveAdds(pHash,vData,fVerbose_00);
  iVar10 = pVVar6->nSize;
  uVar14 = iVar10 / 6;
  qsort(pVVar6->pArray,(long)(int)uVar14,0x18,Ree_ManCompare);
  if (fVerbose != 0) {
    iVar12 = __ptr_00->nSize;
    iVar11 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar11 = iVar12;
    }
    printf("Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n",
           SUB84(((double)((iVar11 >> 2) + -1) * 6.0) / (double)iVar10,0),(ulong)uVar14,
           (ulong)(uint)(vData->nSize / 3));
  }
  if (vData->pArray != (int *)0x0) {
    free(vData->pArray);
    vData->pArray = (int *)0x0;
  }
  free(vData);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  free(__ptr_00);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  free(pHash);
  Ree_ManRemoveTrivial(p,pVVar6);
  Ree_ManRemoveContained(p,pVVar6);
  return pVVar6;
}

Assistant:

Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose )
{
    extern void Ree_ManRemoveTrivial( Gia_Man_t * p, Vec_Int_t * vAdds );
    extern void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds );
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    Vec_Int_t * vAdds;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vData = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
        Vec_IntPush( vCuts, 0xAA );
    }
    if ( pvXors ) *pvXors = Vec_IntAlloc( 1000 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Ree_ManCutMerge( p, i, pList0, pList1, vTemp, pHash, vData, pvXors ? *pvXors : NULL );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    vAdds = Ree_ManDeriveAdds( pHash, vData, fVerbose );
    qsort( Vec_IntArray(vAdds), (size_t)(Vec_IntSize(vAdds)/6), 24, (int (*)(const void *, const void *))Ree_ManCompare );
    if ( fVerbose )
        printf( "Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n", 
            Vec_IntSize(vAdds)/6, Vec_IntSize(vData)/3, Hash_IntManEntryNum(pHash), 6.0*Hash_IntManEntryNum(pHash)/Vec_IntSize(vAdds) );
    Vec_IntFree( vData );
    Hash_IntManStop( pHash );
    Ree_ManRemoveTrivial( p, vAdds );
    Ree_ManRemoveContained( p, vAdds );
    //Ree_ManPrintAdders( vAdds, 1 );
    return vAdds;
}